

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O0

char * __thiscall glcts::TessellationShaderBarrier3::getVSCode(TessellationShaderBarrier3 *this)

{
  TessellationShaderBarrier3 *this_local;
  
  return getVSCode::vs_code;
}

Assistant:

const char* TessellationShaderBarrier3::getVSCode()
{
	static const char* vs_code = "${VERSION}\n"
								 "\n"
								 "void main()\n"
								 "{\n"
								 "}\n";

	return vs_code;
}